

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O2

Rational * __thiscall Rational::operator-(Rational *__return_storage_ptr__,Rational *this)

{
  BigInteger local_30;
  
  Rational(__return_storage_ptr__,this);
  BigInteger::operator-(&local_30,&__return_storage_ptr__->_numerator);
  BigInteger::operator=(&__return_storage_ptr__->_numerator,&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

const Rational operator-() const
    {
        Rational temp(*this);
        temp._numerator = -temp._numerator;
        return temp;
    }